

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumBilerpTexture *
pbrt::SpectrumBilerpTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumBilerpTexture *pSVar2;
  Allocator alloc_00;
  Allocator alloc_01;
  Allocator alloc_02;
  Allocator alloc_03;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_fc;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  TextureMapping2DHandle map;
  ulong local_d0;
  SpectrumHandle local_c8 [4];
  ulong local_a8;
  SpectrumHandle local_a0 [4];
  ulong local_80;
  SpectrumHandle local_78 [4];
  ulong local_58;
  string local_50 [32];
  undefined4 extraout_var_01;
  
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  uVar3 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar1) = 0x3f800000;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"v00",&local_f9);
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_58 = uVar3;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)(local_e8 + 8),(string *)parameters,
             (SpectrumHandle *)local_50,(SpectrumType)&local_58,alloc_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"v01",&local_fa);
  uVar4 = CONCAT44(extraout_var_00,iVar1) | 0x1000000000000;
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  local_80 = uVar4;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_e8,(string *)parameters,local_78,
             (SpectrumType)&local_80,alloc_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"v10",&local_fb);
  alloc_02.memoryResource._4_4_ = 0;
  alloc_02.memoryResource._0_4_ = spectrumType;
  local_a8 = uVar3;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)(local_f8 + 8),(string *)parameters,local_a0,
             (SpectrumType)&local_a8,alloc_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"v11",&local_fc);
  alloc_03.memoryResource._4_4_ = 0;
  alloc_03.memoryResource._0_4_ = spectrumType;
  local_d0 = uVar4;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_f8,(string *)parameters,local_c8,
             (SpectrumType)&local_d0,alloc_03);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
  pSVar2 = (SpectrumBilerpTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar2->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (uintptr_t)
          map.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  (pSVar2->v00).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_e8._8_8_;
  (pSVar2->v01).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_e8._0_8_;
  (pSVar2->v10).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_f8._8_8_;
  (pSVar2->v11).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_f8._0_8_;
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_50);
  return pSVar2;
}

Assistant:

SpectrumBilerpTexture *SpectrumBilerpTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumBilerpTexture>(
        map, parameters.GetOneSpectrum("v00", zero, spectrumType, alloc),
        parameters.GetOneSpectrum("v01", one, spectrumType, alloc),
        parameters.GetOneSpectrum("v10", zero, spectrumType, alloc),
        parameters.GetOneSpectrum("v11", one, spectrumType, alloc));
}